

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O2

void Rml::Parse::Additive(DataParser *parser)

{
  char cVar1;
  Variant local_50;
  
  Term(parser);
  do {
    if (parser->reached_end != false) {
      return;
    }
    cVar1 = (parser->expression)._M_dataplus._M_p[parser->index];
    if (cVar1 == '-') {
      DataParser::Match(parser,'-',true);
      DataParser::Push(parser);
      Term(parser);
      DataParser::Pop(parser,L);
      Variant::Variant(&local_50);
      DataParser::Emit(parser,Subtract,&local_50);
    }
    else {
      if (cVar1 != '+') {
        return;
      }
      DataParser::Match(parser,'+',true);
      DataParser::Push(parser);
      Term(parser);
      DataParser::Pop(parser,L);
      Variant::Variant(&local_50);
      DataParser::Emit(parser,Add,&local_50);
    }
    Variant::~Variant(&local_50);
  } while( true );
}

Assistant:

static void Additive(DataParser& parser)
	{
		Term(parser);

		bool looping = true;
		while (looping)
		{
			switch (parser.Look())
			{
			case '+': Add(parser); break;
			case '-': Subtract(parser); break;
			default: looping = false;
			}
		}
	}